

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

ostream * pstore::file::operator<<(ostream *os,file_handle *fh)

{
  ostream *poVar1;
  string asStack_38 [32];
  
  poVar1 = std::operator<<(os,"{ file:\"");
  std::__cxx11::string::string(asStack_38,(string *)&fh->path_);
  poVar1 = std::operator<<(poVar1,asStack_38);
  poVar1 = std::operator<<(poVar1,"\" }");
  std::__cxx11::string::~string(asStack_38);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, file_handle const & fh) {
            return os << R"({ file:")" << fh.path () << R"(" })";
        }